

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O2

size_t default_decrypt_cid(quicly_cid_encryptor_t *_self,quicly_cid_plaintext_t *plaintext,
                          void *encrypted,size_t len)

{
  uint uVar1;
  _func_size_t_st_quicly_cid_encryptor_t_ptr_quicly_cid_plaintext_t_ptr_void_ptr_size_t *p_Var2;
  uint *puVar3;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  uint8_t ptbuf [16];
  
  puVar3 = (uint *)ptbuf;
  p_Var2 = _self[1].decrypt_cid;
  sVar5 = *(size_t *)(*(long *)p_Var2 + 0x10);
  if ((len == 0) || (bVar6 = sVar5 == len, sVar5 = len, bVar6)) {
    (**(code **)(p_Var2 + 0x18))(p_Var2,ptbuf);
    if (sVar5 == 0x10) {
      puVar3 = (uint *)(ptbuf + 8);
      uVar4 = (ulong)ptbuf._0_8_ >> 0x38 | (ptbuf._0_8_ & 0xff000000000000) >> 0x28 |
              (ptbuf._0_8_ & 0xff0000000000) >> 0x18 | (ptbuf._0_8_ & 0xff00000000) >> 8 |
              (ptbuf._0_8_ & 0xff000000) << 8 | (ptbuf._0_8_ & 0xff0000) << 0x18 |
              (ptbuf._0_8_ & 0xff00) << 0x28 | ptbuf._0_8_ << 0x38;
    }
    else {
      uVar4 = 0;
    }
    plaintext->node_id = uVar4;
    uVar1 = *puVar3;
    plaintext->master_id =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = puVar3[1];
    *(uint *)&plaintext->field_0x4 =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if ((long)puVar3 + (8 - (long)ptbuf) != sVar5) {
      __assert_fail("p - ptbuf == len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                    ,0xad,
                    "size_t default_decrypt_cid(quicly_cid_encryptor_t *, quicly_cid_plaintext_t *, const void *, size_t)"
                   );
    }
  }
  else {
    sVar5 = 0xffffffffffffffff;
  }
  return sVar5;
}

Assistant:

static size_t default_decrypt_cid(quicly_cid_encryptor_t *_self, quicly_cid_plaintext_t *plaintext, const void *encrypted,
                                  size_t len)
{
    struct st_quicly_default_encrypt_cid_t *self = (void *)_self;
    uint8_t ptbuf[16];
    const uint8_t *p;

    if (len != 0) {
        /* long header packet; decrypt only if given Connection ID matches the expected size */
        if (len != self->cid_decrypt_ctx->algo->block_size)
            return SIZE_MAX;
    } else {
        /* short header packet; we are the one to name the size */
        len = self->cid_decrypt_ctx->algo->block_size;
    }

    /* decrypt */
    ptls_cipher_encrypt(self->cid_decrypt_ctx, ptbuf, encrypted, len);

    /* decode */
    p = ptbuf;
    if (len == 16) {
        plaintext->node_id = quicly_decode64(&p);
    } else {
        plaintext->node_id = 0;
    }
    plaintext->master_id = quicly_decode32(&p);
    plaintext->thread_id = quicly_decode24(&p);
    plaintext->path_id = *p++;
    assert(p - ptbuf == len);

    return len;
}